

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall CConnman::PerformReconnections(CConnman *this)

{
  list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> *plVar1;
  size_t *psVar2;
  int iVar3;
  _List_node_base *p_Var4;
  long in_FS_OFFSET;
  list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> todo;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock105;
  _List_node_base local_60;
  long local_50;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = &this->m_reconnections;
  do {
    local_50 = 0;
    local_48._M_owns = false;
    local_60._M_next = &local_60;
    local_60._M_prev = &local_60;
    local_48._M_device = &(this->m_reconnections_mutex).super_mutex;
    std::unique_lock<std::mutex>::lock(&local_48);
    p_Var4 = (_List_node_base *)
             (plVar1->
             super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)plVar1) {
      iVar3 = 3;
    }
    else {
      iVar3 = 0;
      if (p_Var4->_M_next != &local_60 && &local_60 != p_Var4) {
        std::__detail::_List_node_base::_M_transfer(&local_60,p_Var4);
        local_50 = local_50 + 1;
        psVar2 = &(this->m_reconnections).
                  super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
                  ._M_impl._M_node._M_size;
        *psVar2 = *psVar2 - 1;
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
    if (p_Var4 != (_List_node_base *)plVar1) {
      if (local_60._M_next[6]._M_next == (_List_node_base *)0x0) {
        p_Var4 = (_List_node_base *)0x0;
      }
      else {
        p_Var4 = local_60._M_next[5]._M_prev;
      }
      iVar3 = 0;
      OpenNetworkConnection
                (this,(CAddress *)(local_60._M_next + 1),false,
                 (CSemaphoreGrant *)&local_60._M_next[4]._M_prev,(char *)p_Var4,
                 *(ConnectionType *)&local_60._M_next[7]._M_prev,
                 *(bool *)((long)&local_60._M_next[7]._M_prev + 4));
    }
    std::__cxx11::
    _List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::_M_clear
              ((_List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
                *)&local_60);
  } while (iVar3 == 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::PerformReconnections()
{
    AssertLockNotHeld(m_reconnections_mutex);
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    while (true) {
        // Move first element of m_reconnections to todo (avoiding an allocation inside the lock).
        decltype(m_reconnections) todo;
        {
            LOCK(m_reconnections_mutex);
            if (m_reconnections.empty()) break;
            todo.splice(todo.end(), m_reconnections, m_reconnections.begin());
        }

        auto& item = *todo.begin();
        OpenNetworkConnection(item.addr_connect,
                              // We only reconnect if the first attempt to connect succeeded at
                              // connection time, but then failed after the CNode object was
                              // created. Since we already know connecting is possible, do not
                              // count failure to reconnect.
                              /*fCountFailure=*/false,
                              std::move(item.grant),
                              item.destination.empty() ? nullptr : item.destination.c_str(),
                              item.conn_type,
                              item.use_v2transport);
    }
}